

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh.cpp
# Opt level: O0

void __thiscall CMU462::DynamicScene::Mesh::draw_edges(Mesh *this)

{
  bool bVar1;
  HalfedgeIter *pHVar2;
  pointer pHVar3;
  EdgeIter *pEVar4;
  Edge *element;
  DrawStyle *this_00;
  pointer pEVar5;
  VertexIter *pVVar6;
  pointer pVVar7;
  pointer pEVar8;
  pointer pHVar9;
  pointer pVVar10;
  _List_const_iterator<CMU462::Halfedge> local_68;
  _List_const_iterator<CMU462::Halfedge> local_60;
  _List_const_iterator<CMU462::Vertex> local_58;
  _List_const_iterator<CMU462::Halfedge> local_50;
  _List_const_iterator<CMU462::Vertex> local_48;
  _Self local_40;
  _Self local_38;
  EdgeCIter e_1;
  DrawStyle *style;
  EdgeIter e;
  Edge *ep;
  Mesh *this_local;
  
  e._M_node = (_List_node_base *)
              HalfedgeElement::getEdge((((this->super_SceneObject).scene)->hovered).element);
  if ((Edge *)e._M_node != (Edge *)0x0) {
    pHVar2 = Edge::halfedge((Edge *)e._M_node);
    pHVar3 = std::_List_iterator<CMU462::Halfedge>::operator->(pHVar2);
    pEVar4 = Halfedge::edge(pHVar3);
    e_1._M_node = pEVar4->_M_node;
    style = (DrawStyle *)e_1._M_node;
    element = elementAddress((EdgeIter)e_1._M_node);
    this_00 = get_draw_style(this,&element->super_HalfedgeElement);
    DrawStyle::style_edge(this_00);
    glBegin(1);
    pEVar5 = std::_List_iterator<CMU462::Edge>::operator->((_List_iterator<CMU462::Edge> *)&style);
    pHVar2 = Edge::halfedge(pEVar5);
    pHVar3 = std::_List_iterator<CMU462::Halfedge>::operator->(pHVar2);
    pVVar6 = Halfedge::vertex(pHVar3);
    pVVar7 = std::_List_iterator<CMU462::Vertex>::operator->(pVVar6);
    glVertex3dv(&pVVar7->position);
    pEVar5 = std::_List_iterator<CMU462::Edge>::operator->((_List_iterator<CMU462::Edge> *)&style);
    pHVar2 = Edge::halfedge(pEVar5);
    pHVar3 = std::_List_iterator<CMU462::Halfedge>::operator->(pHVar2);
    pHVar2 = Halfedge::twin(pHVar3);
    pHVar3 = std::_List_iterator<CMU462::Halfedge>::operator->(pHVar2);
    pVVar6 = Halfedge::vertex(pHVar3);
    pVVar7 = std::_List_iterator<CMU462::Vertex>::operator->(pVVar6);
    glVertex3dv(&pVVar7->position);
    glEnd();
  }
  DrawStyle::style_edge(this->defaultStyle);
  glBegin(1);
  local_38._M_node = (_List_node_base *)HalfedgeMesh::edgesBegin(&this->mesh);
  while( true ) {
    local_40._M_node = (_List_node_base *)HalfedgeMesh::edgesEnd(&this->mesh);
    bVar1 = std::operator!=(&local_38,&local_40);
    if (!bVar1) break;
    pEVar8 = std::_List_const_iterator<CMU462::Edge>::operator->(&local_38);
    local_50._M_node = (_List_node_base *)Edge::halfedge(pEVar8);
    pHVar9 = std::_List_const_iterator<CMU462::Halfedge>::operator->(&local_50);
    local_48._M_node = (_List_node_base *)Halfedge::vertex(pHVar9);
    pVVar10 = std::_List_const_iterator<CMU462::Vertex>::operator->(&local_48);
    glVertex3dv(&pVVar10->position);
    pEVar8 = std::_List_const_iterator<CMU462::Edge>::operator->(&local_38);
    local_68._M_node = (_List_node_base *)Edge::halfedge(pEVar8);
    pHVar9 = std::_List_const_iterator<CMU462::Halfedge>::operator->(&local_68);
    local_60._M_node = (_List_node_base *)Halfedge::twin(pHVar9);
    pHVar9 = std::_List_const_iterator<CMU462::Halfedge>::operator->(&local_60);
    local_58._M_node = (_List_node_base *)Halfedge::vertex(pHVar9);
    pVVar10 = std::_List_const_iterator<CMU462::Vertex>::operator->(&local_58);
    glVertex3dv(&pVVar10->position);
    std::_List_const_iterator<CMU462::Edge>::operator++(&local_38,0);
  }
  glEnd();
  DrawStyle::style_reset(this->defaultStyle);
  return;
}

Assistant:

void Mesh::draw_edges() const
{

   // Draw seleted edge
   Edge* ep = scene->hovered.element->getEdge();
   if( ep )
   {
      EdgeIter e = ep->halfedge()->edge();

      DrawStyle *style = get_draw_style(elementAddress(e));
      style->style_edge();

      glBegin(GL_LINES);
      glVertex3dv(&e->halfedge()->vertex()->position.x);
      glVertex3dv(&e->halfedge()->twin()->vertex()->position.x);
      glEnd();
   }

   // Draw all edges
   defaultStyle->style_edge();
   glBegin(GL_LINES);
   for( EdgeCIter e = mesh.edgesBegin(); e != mesh.edgesEnd(); e++ )
   {
      glVertex3dv(&e->halfedge()->vertex()->position.x);
      glVertex3dv(&e->halfedge()->twin()->vertex()->position.x);
   }
   glEnd();

   defaultStyle->style_reset();
}